

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

DOHcode doh_store_cname(uchar *doh,size_t dohlen,uint index,dohentry *d)

{
  byte bVar1;
  int iVar2;
  CURLcode CVar3;
  dynbuf *s;
  size_t sVar4;
  bool bVar5;
  int newpos;
  uchar length;
  uint loop;
  dynbuf *c;
  dohentry *d_local;
  uint index_local;
  size_t dohlen_local;
  uchar *doh_local;
  
  newpos = 0x80;
  if (d->numcname == 4) {
    doh_local._4_4_ = DOH_OK;
  }
  else {
    iVar2 = d->numcname;
    d->numcname = iVar2 + 1;
    s = d->cname + iVar2;
    d_local._4_4_ = index;
    do {
      if (dohlen <= d_local._4_4_) {
        return DOH_DNS_OUT_OF_RANGE;
      }
      bVar1 = doh[d_local._4_4_];
      if ((bVar1 & 0xc0) == 0xc0) {
        if (dohlen <= d_local._4_4_ + 1) {
          return DOH_DNS_OUT_OF_RANGE;
        }
        d_local._4_4_ = (bVar1 & 0x3f) << 8 | (uint)doh[d_local._4_4_ + 1];
      }
      else {
        if ((bVar1 & 0xc0) != 0) {
          return DOH_DNS_BAD_LABEL;
        }
        d_local._4_4_ = d_local._4_4_ + 1;
        if (bVar1 != 0) {
          sVar4 = Curl_dyn_len(s);
          if ((sVar4 != 0) && (CVar3 = Curl_dyn_addn(s,".",1), CVar3 != CURLE_OK)) {
            return DOH_OUT_OF_MEM;
          }
          if (dohlen < d_local._4_4_ + bVar1) {
            return DOH_DNS_BAD_LABEL;
          }
          CVar3 = Curl_dyn_addn(s,doh + d_local._4_4_,(ulong)bVar1);
          if (CVar3 != CURLE_OK) {
            return DOH_OUT_OF_MEM;
          }
          d_local._4_4_ = bVar1 + d_local._4_4_;
        }
      }
      bVar5 = false;
      if (bVar1 != 0) {
        newpos = newpos + -1;
        bVar5 = newpos != 0;
      }
    } while (bVar5);
    if (newpos == 0) {
      doh_local._4_4_ = DOH_DNS_LABEL_LOOP;
    }
    else {
      doh_local._4_4_ = DOH_OK;
    }
  }
  return doh_local._4_4_;
}

Assistant:

static DOHcode doh_store_cname(const unsigned char *doh, size_t dohlen,
                               unsigned int index, struct dohentry *d)
{
  struct dynbuf *c;
  unsigned int loop = 128; /* a valid DNS name can never loop this much */
  unsigned char length;

  if(d->numcname == DOH_MAX_CNAME)
    return DOH_OK; /* skip! */

  c = &d->cname[d->numcname++];
  do {
    if(index >= dohlen)
      return DOH_DNS_OUT_OF_RANGE;
    length = doh[index];
    if((length & 0xc0) == 0xc0) {
      int newpos;
      /* name pointer, get the new offset (14 bits) */
      if((index + 1) >= dohlen)
        return DOH_DNS_OUT_OF_RANGE;

      /* move to the new index */
      newpos = (length & 0x3f) << 8 | doh[index + 1];
      index = (unsigned int)newpos;
      continue;
    }
    else if(length & 0xc0)
      return DOH_DNS_BAD_LABEL; /* bad input */
    else
      index++;

    if(length) {
      if(Curl_dyn_len(c)) {
        if(Curl_dyn_addn(c, STRCONST(".")))
          return DOH_OUT_OF_MEM;
      }
      if((index + length) > dohlen)
        return DOH_DNS_BAD_LABEL;

      if(Curl_dyn_addn(c, &doh[index], length))
        return DOH_OUT_OF_MEM;
      index += length;
    }
  } while(length && --loop);

  if(!loop)
    return DOH_DNS_LABEL_LOOP;
  return DOH_OK;
}